

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

char * __thiscall cplus::lang::StringSet::getStruction(StringSet *this)

{
  char *pcVar1;
  size_t id;
  CPlusString swap;
  undefined8 local_88;
  StringBuilder local_80;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_80.value._M_dataplus._M_p = (pointer)&local_80.value.field_2;
  local_80.value.field_2._M_allocated_capacity = 0;
  local_80.value.field_2._8_8_ = 0;
  local_80.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128620;
  local_80.value._M_string_length = 0;
  local_88 = 0;
  utils::StringBuilder::append(&local_80,"[");
  local_40 = std::
             _Function_handler<void_(cplus::lang::StringSet::TreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tursom[P]cplus/cplus/lang/String.cpp:154:19)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(cplus::lang::StringSet::TreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tursom[P]cplus/cplus/lang/String.cpp:154:19)>
             ::_M_manager;
  local_58._M_unused._M_object = &local_80;
  local_58._8_8_ = &local_88;
  TreeNode::forEach(this->root,(function<void_(cplus::lang::StringSet::TreeNode_*)> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  utils::StringBuilder::append(&local_80,"]");
  pcVar1 = utils::StringBuilder::c_str(&local_80);
  CPlusString::CPlusString((CPlusString *)&local_58,pcVar1);
  struction = CPlusString::getStr((CPlusString *)&local_58);
  CPlusString::setToNull((CPlusString *)&local_58);
  pcVar1 = struction;
  CPlusString::~CPlusString((CPlusString *)&local_58);
  utils::StringBuilder::~StringBuilder(&local_80);
  return pcVar1;
}

Assistant:

char *getStruction() const {
				utils::StringBuilder sb = utils::StringBuilder();
				size_t id = 0;
				sb.append("[");
				root->forEach([&sb, &id](TreeNode *it) {
					if (id != 0) {
						sb.append(",");
					}
					sb.append(R"({"node":")");
					sb.append((void *) it);
					sb.append(R"(","parent":")");
					sb.append((void *) it->getParent());
					sb.append(R"(","left":")");
					sb.append((void *) it->getLeft());
					sb.append(R"(","right":")");
					sb.append((void *) it->getRight());
					sb.append(R"(","color":")");
					sb.append(it->isRed() ? "RED" : "BLACK");
					sb.append(R"(","size":")");
					sb.append((unsigned long) it->getSize());
					sb.append(R"(","leftOrRight":")");
					sb.append(it->isLeftNode() ? "LEFT" : "RIGHT");
					sb.append(R"(","value":")");
					
					auto strSize = it->get()->getSize();
					auto *buffer = new char[strSize * 2];
					escapeString(buffer, it->get()->getStr(), strSize);
					sb.append(buffer);
					delete[] buffer;
					
					sb.append("\"}");
					++id;
				});
				sb.append("]");
				auto swap = CPlusString(sb.c_str());
				struction = swap.getStr();
				swap.setToNull();
				return struction;
			}